

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfobjs.c
# Opt level: O1

FT_String * tt_name_ascii_from_other(TT_Name entry,FT_Memory memory)

{
  ushort uVar1;
  FT_Byte *pFVar2;
  undefined8 in_RAX;
  FT_String *pFVar3;
  ulong uVar4;
  ulong uVar5;
  FT_String *pFVar6;
  FT_Byte FVar7;
  FT_Error error;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  pFVar2 = entry->string;
  uVar1 = entry->stringLength;
  uVar5 = (ulong)uVar1;
  pFVar3 = (FT_String *)ft_mem_qrealloc(memory,1,0,uVar5 + 1,(void *)0x0,&local_24);
  pFVar6 = (FT_String *)0x0;
  if (local_24 == 0) {
    if (uVar1 == 0) {
      uVar5 = 0;
    }
    else {
      uVar4 = 0;
      do {
        FVar7 = pFVar2[uVar4];
        if (FVar7 == '\0') {
          uVar5 = uVar4 & 0xffffffff;
          break;
        }
        if ((char)FVar7 < ' ') {
          FVar7 = '?';
        }
        pFVar3[uVar4] = FVar7;
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
    pFVar3[uVar5] = '\0';
    pFVar6 = pFVar3;
  }
  return pFVar6;
}

Assistant:

static FT_String*
  tt_name_ascii_from_other( TT_Name    entry,
                            FT_Memory  memory )
  {
    FT_String*  string = NULL;
    FT_UInt     len, code, n;
    FT_Byte*    read   = (FT_Byte*)entry->string;
    FT_Error    error;


    len = (FT_UInt)entry->stringLength;

    if ( FT_QNEW_ARRAY( string, len + 1 ) )
      return NULL;

    for ( n = 0; n < len; n++ )
    {
      code = *read++;

      if ( code == 0 )
        break;

      if ( code < 32 || code > 127 )
        code = '?';

      string[n] = (char)code;
    }

    string[n] = 0;

    return string;
  }